

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin_test.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  callback<bar_base_*(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  cVar3;
  char cVar4;
  int iVar5;
  callable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *tmp;
  string *psVar6;
  ulong uVar7;
  copyable *pcVar8;
  string *psVar9;
  bar_base *pbVar10;
  ostream *poVar11;
  runtime_error *prVar12;
  _Self __tmp_1;
  _Self __tmp;
  scope sc;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  service srv;
  callback<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  cb;
  value params;
  ostringstream oss;
  string path;
  scope asStack_248 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  callback<bar_base_*(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_1f0;
  callback<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_1e8;
  value local_1e0;
  string local_1d8 [12];
  intrusive_ptr<booster::callable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
  local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (argc != 2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Usage plugin_test /path/to/the/plugin/dir",0x29);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '`');
    std::ostream::put('`');
    std::ostream::flush();
    return 1;
  }
  std::__cxx11::string::string((string *)&local_50,argv[1],(allocator *)local_1d8);
  cppcms::json::value::copyable::copyable(&local_1e0.d);
  cppcms::json::value::value<std::__cxx11::string>((value *)&local_210,&local_50);
  paVar2 = &local_1d8[0].field_2;
  local_1d8[0]._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"plugin","");
  psVar6 = (string *)cppcms::json::value::operator[]((string *)&local_1e0);
  paVar1 = &local_240.field_2;
  local_240._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"paths","");
  uVar7 = cppcms::json::value::operator[](psVar6);
  pcVar8 = (copyable *)cppcms::json::value::operator[](uVar7);
  cppcms::json::value::copyable::operator=(pcVar8,(copyable *)&local_210);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != paVar1) {
    operator_delete(local_240._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_1d8[0]._M_dataplus._M_p);
  }
  cppcms::json::value::copyable::~copyable((copyable *)&local_210);
  cppcms::json::value::value<char[7]>((value *)&local_210,(char (*) [7])"plugin");
  local_1d8[0]._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"plugin","");
  psVar6 = (string *)cppcms::json::value::operator[]((string *)&local_1e0);
  local_240._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"modules","");
  uVar7 = cppcms::json::value::operator[](psVar6);
  pcVar8 = (copyable *)cppcms::json::value::operator[](uVar7);
  cppcms::json::value::copyable::operator=(pcVar8,(copyable *)&local_210);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != paVar1) {
    operator_delete(local_240._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_1d8[0]._M_dataplus._M_p);
  }
  cppcms::json::value::copyable::~copyable((copyable *)&local_210);
  cppcms::plugin::scope::scope(asStack_248,&local_1e0);
  local_1d8[0]._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"plugin","");
  cVar4 = cppcms::plugin::scope::is_loaded_by_this_scope((string *)asStack_248);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_1d8[0]._M_dataplus._M_p);
  }
  if (cVar4 == '\0') {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1d8,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/plugin_test.cpp"
               ,0x5e);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8,":",1);
    poVar11 = (ostream *)std::ostream::operator<<((ostream *)local_1d8,0x1a);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar11," sc.is_loaded_by_this_scope(\"plugin\")",0x25);
    prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar12,(string *)&local_240);
    __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_1d8[0]._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"plugin","");
  cVar4 = cppcms::plugin::scope::is_loaded((string *)local_1d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_1d8[0]._M_dataplus._M_p);
  }
  if (cVar4 == '\0') {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1d8,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/plugin_test.cpp"
               ,0x5e);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8,":",1);
    poVar11 = (ostream *)std::ostream::operator<<((ostream *)local_1d8,0x1b);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar11," cppcms::plugin::scope::is_loaded(\"plugin\")",0x2b);
    prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar12,(string *)&local_240);
    __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"- Normal call",0xd);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  local_1e8.call_ptr.p_ =
       (pointer_type)
       (callable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
        *)0x0;
  psVar9 = (string *)cppcms::plugin::manager::instance();
  local_1d8[0]._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"foo","");
  local_240._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"lower","");
  cppcms::plugin::manager::entry<std::__cxx11::string(std::__cxx11::string_const&)>
            ((manager *)&local_1f0,psVar9,local_1d8);
  cVar3.call_ptr.p_ = local_1f0.call_ptr.p_;
  local_1f0.call_ptr.p_ =
       (pointer_type)
       (callable<bar_base_*(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
        *)0x0;
  local_210._M_dataplus._M_p = (pointer)local_1e8.call_ptr.p_;
  local_1e8.call_ptr.p_ = (pointer_type)(pointer_type)cVar3.call_ptr.p_;
  booster::
  intrusive_ptr<booster::callable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
  ::~intrusive_ptr((intrusive_ptr<booster::callable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
                    *)&local_210);
  booster::
  intrusive_ptr<booster::callable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
  ::~intrusive_ptr((intrusive_ptr<booster::callable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
                    *)&local_1f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != paVar1) {
    operator_delete(local_240._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_1d8[0]._M_dataplus._M_p);
  }
  local_240._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"Hello World","");
  booster::
  callback<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::operator()(local_1d8,&local_1e8,&local_240);
  iVar5 = std::__cxx11::string::compare((char *)local_1d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_1d8[0]._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != paVar1) {
    operator_delete(local_240._M_dataplus._M_p);
  }
  if (iVar5 == 0) {
    psVar9 = (string *)cppcms::plugin::manager::instance();
    local_1d8[0]._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"foo","");
    local_240._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"bar::create","");
    cppcms::plugin::manager::entry<bar_base*(std::__cxx11::string_const&)>
              ((manager *)&local_1f0,psVar9,local_1d8);
    local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"hello","");
    pbVar10 = booster::
              callback<bar_base_*(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              ::operator()(&local_1f0,&local_210);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p);
    }
    booster::
    intrusive_ptr<booster::callable<bar_base_*(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
    ::~intrusive_ptr(&local_1f0.call_ptr);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != paVar1) {
      operator_delete(local_240._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8[0]._M_dataplus._M_p != paVar2) {
      operator_delete(local_1d8[0]._M_dataplus._M_p);
    }
    (*(code *)**(undefined8 **)pbVar10)(pbVar10);
    local_1d8[0]._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"hello","");
    iVar5 = std::__cxx11::string::compare((char *)local_1d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8[0]._M_dataplus._M_p != paVar2) {
      operator_delete(local_1d8[0]._M_dataplus._M_p);
    }
    if (iVar5 == 0) {
      (**(code **)(*(long *)pbVar10 + 0x10))(pbVar10);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"- Bad signature",0xf);
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      psVar9 = (string *)cppcms::plugin::manager::instance();
      local_1d8[0]._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"foo","");
      local_240._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"lower","");
      cppcms::plugin::manager::entry<std::__cxx11::string(std::__cxx11::string&)>
                ((manager *)&local_58,psVar9,local_1d8);
      booster::
      intrusive_ptr<booster::callable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
      ::~intrusive_ptr(&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240._M_dataplus._M_p != paVar1) {
        operator_delete(local_240._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8[0]._M_dataplus._M_p != paVar2) {
        operator_delete(local_1d8[0]._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1d8,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/plugin_test.cpp"
                 ,0x5e);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8,":",1);
      poVar11 = (ostream *)std::ostream::operator<<((ostream *)local_1d8,0x27);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11," !\"Never Get There\"",0x13);
      prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar12,(string *)&local_240);
      __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1d8,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/plugin_test.cpp"
               ,0x5e);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8,":",1);
    poVar11 = (ostream *)std::ostream::operator<<((ostream *)local_1d8,0x22);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar11," b->msg() == std::string(\"hello\")",0x21);
    prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar12,(string *)&local_240);
    __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8,"Error ",6);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1d8,
             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/plugin_test.cpp"
             ,0x5e);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8,":",1);
  poVar11 = (ostream *)std::ostream::operator<<((ostream *)local_1d8,0x20);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11," cb(\"Hello World\")==\"hello world\"",0x21);
  prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar12,(string *)&local_240);
  __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int main(int argc,char **argv)
{
	if(argc!=2) {
		std::cerr << "Usage plugin_test /path/to/the/plugin/dir" << std::endl;
		return 1;
	}
	std::string path = argv[1];
	cppcms::json::value params;

	params["plugin"]["paths"][0]=path;
	params["plugin"]["modules"][0]="plugin";

	try {
		using cppcms::plugin::manager;
		{
			cppcms::plugin::scope sc(params);
			TEST(sc.is_loaded_by_this_scope("plugin"));
			TEST(cppcms::plugin::scope::is_loaded("plugin"));

			std::cout << "- Normal call" << std::endl;
			booster::callback<std::string(std::string const &)> cb;
			cb = manager::instance().entry<std::string(std::string const &)>("foo","lower");
			TEST(cb("Hello World")=="hello world");
			bar_base *b=manager::instance().entry<bar_base *(std::string const &)>("foo","bar::create")("hello");
			TEST(b->msg() == std::string("hello"));
			delete b;
			try {
				std::cout << "- Bad signature" << std::endl;
				manager::instance().entry<std::string(std::string &)>("foo","lower");
				TEST(!"Never Get There");
			}
			catch(cppcms::plugin::signature_error const &e) {
				std::string msg = e.what();
				TEST(msg.find("std::string(std::string const &)")!=std::string::npos);
			}
			catch(...) { throw std::runtime_error("Something else thrown"); }
			std::cout << "- Iteration" << std::endl;
			TEST(manager::instance().has_plugin("foo"));
			TEST(manager::instance().plugins().size()==1);
			TEST(*manager::instance().plugins().begin()=="foo");
			TEST(manager::instance().entries("foo").size()==3);
			std::set<std::string> names = manager::instance().entries("foo");
			std::set<std::string>::iterator p=names.begin();
			TEST(*p++ == "bar::create");
			TEST(*p++ == "counter");
			TEST(*p++ == "lower");
			TEST(p==names.end());
			TEST(manager::instance().entry<int()>("foo","counter")()==1);
			TEST(manager::instance().entry<int()>("foo","counter")()==2);
		} 
		std::cout << "- Unload" << std::endl;
		TEST(!cppcms::plugin::scope::is_loaded("plugin"));
		try {
			manager::instance().entry<std::string(std::string const &)>("foo","lower");
			std::cerr << "Must Not get there:" << __LINE__<<std::endl;
			return 1;
		}
		catch(cppcms::cppcms_error const &) {}
		catch(...) { throw std::runtime_error("Something else thrown"); }
		TEST(cppcms::plugin::manager::instance().has_plugin("foo")==false);
		std::cout << "- Scope vs Service" << std::endl;
		{
			cppcms::service srv(params);
			TEST(manager::instance().has_plugin("foo"));
			TEST(manager::instance().entry<int()>("foo","counter")()==1);
			TEST(manager::instance().entry<int()>("foo","counter")()==2);
			TEST(srv.plugins().is_loaded_by_this_scope("plugin"));
			TEST(cppcms::plugin::scope::is_loaded("plugin"));
			{
				cppcms::plugin::scope sc(params);
				TEST(!sc.is_loaded_by_this_scope("plugin"));
				TEST(manager::instance().entry<int()>("foo","counter")()==3);
			}
			TEST(manager::instance().entry<int()>("foo","counter")()==4);
		}
		{
			cppcms::plugin::scope sc(params);
			TEST(manager::instance().has_plugin("foo"));
			TEST(manager::instance().entry<int()>("foo","counter")()==1);
			TEST(manager::instance().entry<int()>("foo","counter")()==2);
			TEST(cppcms::plugin::scope::is_loaded("plugin"));
			{
				cppcms::service srv(params);
				TEST(!srv.plugins().is_loaded_by_this_scope("plugin"));
				TEST(sc.is_loaded_by_this_scope("plugin"));
				TEST(manager::instance().entry<int()>("foo","counter")()==3);
			}
			TEST(manager::instance().entry<int()>("foo","counter")()==4);
		}
		TEST(!manager::instance().has_plugin("foo"));
		TEST(!cppcms::plugin::scope::is_loaded("plugin"));
	}
	catch(std::exception const &e) {
		std::cerr << "Error:" << e.what() << std::endl;
		return 1;
	}
	std::cout << "Ok" << std::endl;
	return 0;
}